

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stubs.h
# Opt level: O0

_Bool fdready(int fd)

{
  int iVar1;
  pollfd local_18;
  pollfd pfd;
  int fd_local;
  
  local_18.events = 0x40;
  local_18.revents = 0;
  local_18.fd = fd;
  pfd.fd = fd;
  iVar1 = poll(&local_18,1,0);
  if (iVar1 == 0) {
    pfd.revents._1_1_ = false;
  }
  else if (iVar1 == 1) {
    pfd.revents._1_1_ = true;
  }
  else {
    pfd.revents._1_1_ = false;
  }
  return pfd.revents._1_1_;
}

Assistant:

bool
fdready(int fd)
{
	struct pollfd pfd;
	pfd.fd      = (PLATFD) fd;
	pfd.events  = POLLRDNORM;
	pfd.revents = 0;

	switch (poll(&pfd, 1, 0)) {
	case 0:
		return (false);
	case 1:
		return (true);
	default:
#ifdef CONVEY_H
		ConveyError("BAD POLL RETURN!");
#elif defined(TEST_CHECK)
		TEST_ASSERT(0);
#endif
		return (false);
	}
}